

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O3

void __thiscall
Assimp::RemoveRedundantMatsProcess::RemoveRedundantMatsProcess(RemoveRedundantMatsProcess *this)

{
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess =
       (_func_int **)&PTR__RemoveRedundantMatsProcess_0080de00;
  (this->mConfigFixedMaterials)._M_dataplus._M_p = (pointer)&(this->mConfigFixedMaterials).field_2;
  (this->mConfigFixedMaterials)._M_string_length = 0;
  (this->mConfigFixedMaterials).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

RemoveRedundantMatsProcess::RemoveRedundantMatsProcess()
: mConfigFixedMaterials() {
    // nothing to do here
}